

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.c
# Opt level: O1

int scep_conf_init(char *filename)

{
  int iVar1;
  long in_RAX;
  CONF_METHOD *meth;
  CONF *conf;
  SCEP_CONF *pSVar2;
  scep_engine_conf_st *psVar3;
  long err;
  long local_18;
  
  if (filename != (char *)0x0) {
    local_18 = in_RAX;
    meth = NCONF_default();
    conf = (CONF *)NCONF_new(meth);
    iVar1 = NCONF_load((CONF *)conf,filename,&local_18);
    if (iVar1 == 0) {
      if (local_18 == 0) {
        fprintf(_stderr,"%s: Error opening configuration file\n",pname);
      }
      else {
        fprintf(_stderr,"%s: Error in %s on line %li\n",pname,filename);
        ERR_print_errors_fp(_stderr);
      }
      exit(0x5d);
    }
    pSVar2 = (SCEP_CONF *)malloc(0x10);
    scep_conf = pSVar2;
    psVar3 = (scep_engine_conf_st *)malloc(0x58);
    pSVar2->engine = psVar3;
    pSVar2->engine_str = (char *)0x0;
    scep_conf_load(conf);
  }
  return 0;
}

Assistant:

int scep_conf_init(char *filename) {
    long err;
    CONF *conf;

    if(filename == NULL) {
        return 0;
    }
    conf = NCONF_new(NCONF_default());
    if(!NCONF_load(conf, filename, &err)) {
        if(err == 0)
            fprintf(stderr, "%s: Error opening configuration file\n", pname);
        else {
            fprintf(stderr, "%s: Error in %s on line %li\n", pname, filename, err);
            ERR_print_errors_fp(stderr);
        }
        exit(SCEP_PKISTATUS_FILE);
    }

    scep_conf = malloc(sizeof(*scep_conf));
    scep_conf->engine = malloc(sizeof(struct scep_engine_conf_st));
    scep_conf->engine_str = NULL;
    if(scep_conf_load(conf) == 0 && v_flag) {
        //report something here?
    }
    return 0;
}